

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.h
# Opt level: O2

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::Statistics::~Statistics(Statistics *this)

{
  (**this->readingTime->_vptr_Timer)();
  (**this->solvingTime->_vptr_Timer)();
  (**this->preprocessingTime->_vptr_Timer)();
  (**this->simplexTime->_vptr_Timer)();
  (**this->syncTime->_vptr_Timer)();
  (**this->transformTime->_vptr_Timer)();
  (**this->rationalTime->_vptr_Timer)();
  (**this->initialPrecisionTime->_vptr_Timer)();
  (**this->extendedPrecisionTime->_vptr_Timer)();
  (**this->reconstructionTime->_vptr_Timer)();
  (**this->boostingStepTime->_vptr_Timer)();
  spx_free<soplex::Timer*>(&this->readingTime);
  spx_free<soplex::Timer*>(&this->solvingTime);
  spx_free<soplex::Timer*>(&this->preprocessingTime);
  spx_free<soplex::Timer*>(&this->simplexTime);
  spx_free<soplex::Timer*>(&this->syncTime);
  spx_free<soplex::Timer*>(&this->transformTime);
  spx_free<soplex::Timer*>(&this->rationalTime);
  spx_free<soplex::Timer*>(&this->initialPrecisionTime);
  spx_free<soplex::Timer*>(&this->extendedPrecisionTime);
  spx_free<soplex::Timer*>(&this->reconstructionTime);
  spx_free<soplex::Timer*>(&this->boostingStepTime);
  return;
}

Assistant:

~Statistics()
   {
      // we need to free all timers again (allocation happens in constructor)
      readingTime->~Timer();
      solvingTime->~Timer();
      preprocessingTime->~Timer();
      simplexTime->~Timer();
      syncTime->~Timer();
      transformTime->~Timer();
      rationalTime->~Timer();
      initialPrecisionTime->~Timer();
      extendedPrecisionTime->~Timer();
      reconstructionTime->~Timer();
      boostingStepTime->~Timer();
      spx_free(readingTime);
      spx_free(solvingTime);
      spx_free(preprocessingTime);
      spx_free(simplexTime);
      spx_free(syncTime);
      spx_free(transformTime);
      spx_free(rationalTime);
      spx_free(initialPrecisionTime);
      spx_free(extendedPrecisionTime);
      spx_free(reconstructionTime);
      spx_free(boostingStepTime);
   }